

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::ShaderMatrixCase::init(ShaderMatrixCase *this,EVP_PKEY_CTX *ctx)

{
  MatrixOp op;
  pointer pMVar1;
  DataType dataType;
  int attribNdx;
  OperationType OVar2;
  int iVar3;
  DataType DVar4;
  TestMatrixType TVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar7;
  char *pcVar8;
  ostream *poVar9;
  ostringstream *poVar10;
  int precision;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string *psVar12;
  uint uVar13;
  char *__s;
  ShaderMatrixCase *pSVar14;
  EVP_PKEY_CTX *ctx_00;
  uint uVar15;
  int row;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  pointer pbVar20;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_00;
  float fVar21;
  ulong uStack_480;
  int local_46c;
  ostringstream *local_468;
  ShaderMatrixCase *local_460;
  ulong local_458;
  DataType resultType;
  Precision local_44c;
  allocator<char> local_445;
  int local_444;
  Matrix<float,_4,_4> local_440;
  char *local_400;
  string operationValue0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passVars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  string inValue0;
  string local_380;
  string operationValue1;
  string inValue1;
  ostringstream vtx;
  ostringstream frag;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  local_468 = (ostringstream *)&frag;
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    local_468 = (ostringstream *)&vtx;
  }
  local_458 = (ulong)(this->m_in0).dataType;
  DVar4 = (this->m_in1).dataType;
  inValue0._M_dataplus._M_p = (pointer)&inValue0.field_2;
  inValue0._M_string_length = 0;
  inValue0.field_2._M_local_buf[0] = '\0';
  inValue1._M_dataplus._M_p = (pointer)&inValue1.field_2;
  inValue1._M_string_length = 0;
  inValue1.field_2._M_local_buf[0] = '\0';
  resultType = TYPE_LAST;
  local_44c = (this->m_in0).precision;
  passVars.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  passVars.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  passVars.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  op = this->m_op;
  local_460 = this;
  OVar2 = MatrixCaseUtils::getOperationType(op);
  if (OVar2 < OPERATIONTYPE_LAST) {
    local_444 = *(int *)(&DAT_009afd1c + (ulong)OVar2 * 4);
  }
  else {
    local_444 = 1;
  }
  dataType = (DataType)local_458;
  operationValue0._M_dataplus._M_p = (pointer)&operationValue0.field_2;
  operationValue0._M_string_length = 0;
  uVar13 = DVar4 - TYPE_FLOAT_MAT2;
  operationValue0.field_2._M_local_buf[0] = '\0';
  operationValue1._M_dataplus._M_p = (pointer)&operationValue1.field_2;
  operationValue1._M_string_length = 0;
  uVar15 = DVar4 - TYPE_DOUBLE_MAT2;
  operationValue1.field_2._M_local_buf[0] = '\0';
  switch(op) {
  case OP_MUL:
    if ((8 < dataType - TYPE_FLOAT_MAT2 && 8 < dataType - TYPE_DOUBLE_MAT2) ||
       (8 < uVar13 && 8 < uVar15)) goto switchD_004f45c7_caseD_3;
    iVar6 = glu::getDataTypeMatrixNumColumns(DVar4);
    iVar3 = glu::getDataTypeMatrixNumRows((local_460->m_in0).dataType);
    DVar4 = glu::getDataTypeMatrix(iVar6,iVar3);
    local_458 = CONCAT44(extraout_var,DVar4);
    break;
  default:
switchD_004f45c7_caseD_3:
    if ((OVar2 & ~OPERATIONTYPE_BINARY_FUNCTION) == OPERATIONTYPE_UNARY_PREFIX_OPERATOR) break;
    if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
      if (uVar13 < 9 || uVar15 < 9) break;
      uVar19 = local_458;
      if (DVar4 != TYPE_FLOAT) {
        iVar6 = glu::getDataTypeMatrixNumRows(dataType);
LAB_004f46f9:
        DVar4 = glu::getDataTypeFloatVec(iVar6);
        uVar19 = (ulong)DVar4;
      }
    }
    else {
      if (uVar13 >= 9 && uVar15 >= 9) {
        uStack_480 = 0x5e;
        goto LAB_004f46ce;
      }
      uVar19 = (ulong)DVar4;
      if (dataType != TYPE_FLOAT) {
        iVar6 = glu::getDataTypeMatrixNumColumns(DVar4);
        goto LAB_004f46f9;
      }
    }
    resultType = (DataType)uVar19;
    local_458 = uVar19;
    goto LAB_004f470d;
  case OP_OUTER_PRODUCT:
    iVar6 = glu::getDataTypeScalarSize(DVar4);
    iVar3 = glu::getDataTypeScalarSize((local_460->m_in0).dataType);
    DVar4 = glu::getDataTypeMatrix(iVar6,iVar3);
    local_458 = CONCAT44(extraout_var_00,DVar4);
    break;
  case OP_TRANSPOSE:
    iVar6 = glu::getDataTypeMatrixNumRows(dataType);
    iVar3 = glu::getDataTypeMatrixNumColumns((local_460->m_in0).dataType);
    DVar4 = glu::getDataTypeMatrix(iVar6,iVar3);
    local_458 = CONCAT44(extraout_var_01,DVar4);
    break;
  case OP_INVERSE:
    break;
  case OP_DETERMINANT:
    resultType = TYPE_FLOAT;
    uStack_480 = 1;
LAB_004f46ce:
    local_458 = uStack_480;
    goto LAB_004f470d;
  }
  resultType = (DataType)local_458;
LAB_004f470d:
  std::operator<<((ostream *)&vtx,"#version 300 es\n");
  std::operator<<((ostream *)&frag,"#version 300 es\n");
  std::operator<<((ostream *)&vtx,"in highp vec4 a_position;\n");
  std::operator<<((ostream *)&frag,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n");
  if ((local_460->super_ShaderRenderCase).m_isVertexCase == true) {
    std::operator<<((ostream *)&vtx,"out mediump vec4 v_color;\n");
    std::operator<<((ostream *)&frag,"in mediump vec4 v_color;\n");
  }
  pSVar14 = local_460;
  local_400 = ";\n";
  for (local_46c = 0; local_46c < local_444; local_46c = local_46c + 1) {
    lVar11 = 0x128;
    if (0 < local_46c) {
      lVar11 = 0x134;
    }
    pcVar7 = glu::getPrecisionName
                       (*(Precision *)
                         ((long)&(pSVar14->super_ShaderRenderCase).super_TestCase.super_TestNode.
                                 m_testCtx + lVar11));
    pcVar8 = glu::getDataTypeName
                       (*(DataType *)
                         ((long)&(pSVar14->super_ShaderRenderCase).super_TestCase.super_TestNode.
                                 _vptr_TestNode + lVar11 + 4));
    psVar12 = &inValue0;
    if (0 < local_46c) {
      psVar12 = &inValue1;
    }
    iVar6 = *(int *)((long)&(pSVar14->super_ShaderRenderCase).super_TestCase.super_TestNode.
                            _vptr_TestNode + lVar11);
    if (iVar6 == 0) {
      poVar9 = std::operator<<((ostream *)local_468,"const ");
      poVar9 = std::operator<<(poVar9,pcVar7);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,pcVar8);
      poVar9 = std::operator<<(poVar9," in");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_46c);
      std::operator<<(poVar9," = ");
      switch(*(undefined4 *)
              ((long)&(local_460->super_ShaderRenderCase).super_TestCase.super_TestNode.
                      _vptr_TestNode + lVar11 + 4)) {
      case 1:
        de::floatToString_abi_cxx11_
                  ((string *)&local_440,(de *)0x1,
                   *(float *)((long)&s_constInFloat + (long)local_46c * 4),precision);
        std::operator<<((ostream *)local_468,(string *)&local_440);
        std::__cxx11::string::~string((string *)&local_440);
        break;
      case 2:
        MatrixCaseUtils::writeVectorConstructor<2>
                  ((ostream *)local_468,(Vector<float,_2> *)(s_constInVec2 + (long)local_46c * 8));
        break;
      case 3:
        MatrixCaseUtils::writeVectorConstructor<3>
                  ((ostream *)local_468,(Vector<float,_3> *)(s_constInVec3 + (long)local_46c * 0xc))
        ;
        break;
      case 4:
        MatrixCaseUtils::writeVectorConstructor<4>
                  ((ostream *)local_468,(Vector<float,_4> *)(s_constInVec4 + (long)local_46c * 0x10)
                  );
        break;
      case 5:
        tcu::Matrix<float,_2,_2>::Matrix
                  ((Matrix<float,_2,_2> *)&local_440,
                   (float *)(s_constInMat2x2 + (long)local_46c * 0x10));
        MatrixCaseUtils::writeMatrixConstructor<2,2>
                  ((ostream *)local_468,(Matrix<float,_2,_2> *)&local_440);
        break;
      case 6:
        tcu::Matrix<float,_3,_2>::Matrix
                  ((Matrix<float,_3,_2> *)&local_440,
                   (float *)(s_constInMat2x3 + (long)local_46c * 0x18));
        MatrixCaseUtils::writeMatrixConstructor<2,3>
                  ((ostream *)local_468,(Matrix<float,_3,_2> *)&local_440);
        break;
      case 7:
        tcu::Matrix<float,_4,_2>::Matrix
                  ((Matrix<float,_4,_2> *)&local_440,
                   (float *)(s_constInMat2x4 + (long)local_46c * 0x20));
        MatrixCaseUtils::writeMatrixConstructor<2,4>
                  ((ostream *)local_468,(Matrix<float,_4,_2> *)&local_440);
        break;
      case 8:
        tcu::Matrix<float,_2,_3>::Matrix
                  ((Matrix<float,_2,_3> *)&local_440,
                   (float *)(s_constInMat3x2 + (long)local_46c * 0x18));
        MatrixCaseUtils::writeMatrixConstructor<3,2>
                  ((ostream *)local_468,(Matrix<float,_2,_3> *)&local_440);
        break;
      case 9:
        tcu::Matrix<float,_3,_3>::Matrix
                  ((Matrix<float,_3,_3> *)&local_440,
                   (float *)(s_constInMat3x3 + (long)local_46c * 0x24));
        MatrixCaseUtils::writeMatrixConstructor<3,3>
                  ((ostream *)local_468,(Matrix<float,_3,_3> *)&local_440);
        break;
      case 10:
        tcu::Matrix<float,_4,_3>::Matrix
                  ((Matrix<float,_4,_3> *)&local_440,
                   (float *)(s_constInMat3x4 + (long)local_46c * 0x30));
        MatrixCaseUtils::writeMatrixConstructor<3,4>
                  ((ostream *)local_468,(Matrix<float,_4,_3> *)&local_440);
        break;
      case 0xb:
        tcu::Matrix<float,_2,_4>::Matrix
                  ((Matrix<float,_2,_4> *)&local_440,
                   (float *)(s_constInMat4x2 + (long)local_46c * 0x20));
        MatrixCaseUtils::writeMatrixConstructor<4,2>
                  ((ostream *)local_468,(Matrix<float,_2,_4> *)&local_440);
        break;
      case 0xc:
        tcu::Matrix<float,_3,_4>::Matrix
                  ((Matrix<float,_3,_4> *)&local_440,
                   (float *)(s_constInMat4x3 + (long)local_46c * 0x30));
        MatrixCaseUtils::writeMatrixConstructor<4,3>
                  ((ostream *)local_468,(Matrix<float,_3,_4> *)&local_440);
        break;
      case 0xd:
        tcu::Matrix<float,_4,_4>::Matrix
                  (&local_440,(float *)(s_constInMat4x4 + (long)local_46c * 0x40));
        MatrixCaseUtils::writeMatrixConstructor<4,4>((ostream *)local_468,&local_440);
      }
      std::operator<<((ostream *)local_468,";\n");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"in",&local_445);
      de::toString<int>(&local_380,&local_46c);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_440
                     ,&local_3c0,&local_380);
LAB_004f4eed:
      __return_storage_ptr__ = &local_380;
      std::__cxx11::string::operator=((string *)psVar12,(string *)&local_440);
      std::__cxx11::string::~string((string *)&local_440);
LAB_004f4f00:
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_3c0);
    }
    else {
      if (iVar6 == 1) {
        poVar9 = std::operator<<((ostream *)local_468,"uniform ");
        poVar9 = std::operator<<(poVar9,pcVar7);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::operator<<(poVar9,pcVar8);
        poVar9 = std::operator<<(poVar9," u_in");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_46c);
        std::operator<<(poVar9,";\n");
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"u_in",&local_445);
        de::toString<int>(&local_380,&local_46c);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_440,&local_3c0,&local_380);
        goto LAB_004f4eed;
      }
      if (iVar6 == 2) {
        poVar9 = std::operator<<((ostream *)&vtx,"in ");
        poVar9 = std::operator<<(poVar9,pcVar7);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::operator<<(poVar9,pcVar8);
        std::operator<<(poVar9," a_");
        iVar6 = *(int *)((long)&(local_460->super_ShaderRenderCase).super_TestCase.super_TestNode.
                                _vptr_TestNode + lVar11 + 4);
        if (8 < iVar6 - 5U && 8 < iVar6 - 0x12U) {
          std::operator<<((ostream *)&vtx,"coords;\n");
          if ((local_460->super_ShaderRenderCase).m_isVertexCase == false) {
            poVar9 = std::operator<<((ostream *)&vtx,"out ");
            poVar9 = std::operator<<(poVar9,pcVar7);
            poVar9 = std::operator<<(poVar9," ");
            poVar9 = std::operator<<(poVar9,pcVar8);
            std::operator<<(poVar9," v_coords;\n");
            poVar9 = std::operator<<((ostream *)&frag,"in ");
            poVar9 = std::operator<<(poVar9,pcVar7);
            poVar9 = std::operator<<(poVar9," ");
            poVar9 = std::operator<<(poVar9,pcVar8);
            std::operator<<(poVar9," v_coords;\n");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_440,"coords",(allocator<char> *)&local_3c0);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &passVars,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_440);
            std::__cxx11::string::~string((string *)&local_440);
          }
          std::__cxx11::string::assign((char *)psVar12);
          goto LAB_004f4f10;
        }
        poVar9 = std::operator<<((ostream *)&vtx,pcVar8);
        std::operator<<(poVar9,";\n");
        __s = "a_";
        if ((local_460->super_ShaderRenderCase).m_isVertexCase == false) {
          poVar9 = std::operator<<((ostream *)&vtx,"out ");
          poVar9 = std::operator<<(poVar9,pcVar7);
          poVar9 = std::operator<<(poVar9," ");
          poVar9 = std::operator<<(poVar9,pcVar8);
          poVar9 = std::operator<<(poVar9," v_");
          poVar9 = std::operator<<(poVar9,pcVar8);
          std::operator<<(poVar9,";\n");
          poVar9 = std::operator<<((ostream *)&frag,"in ");
          poVar9 = std::operator<<(poVar9,pcVar7);
          poVar9 = std::operator<<(poVar9," ");
          poVar9 = std::operator<<(poVar9,pcVar8);
          poVar9 = std::operator<<(poVar9," v_");
          poVar9 = std::operator<<(poVar9,pcVar8);
          std::operator<<(poVar9,";\n");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_440,pcVar8,(allocator<char> *)&local_3c0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&passVars,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_440
                    );
          std::__cxx11::string::~string((string *)&local_440);
          __s = "v_";
          if (((local_460->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
            __s = "a_";
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c0,__s,(allocator<char> *)&local_380);
        pcVar7 = glu::getDataTypeName
                           (*(DataType *)
                             ((long)&(local_460->super_ShaderRenderCase).super_TestCase.
                                     super_TestNode._vptr_TestNode + lVar11 + 4));
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_440;
        std::operator+(__return_storage_ptr__,&local_3c0,pcVar7);
        std::__cxx11::string::operator=((string *)psVar12,(string *)__return_storage_ptr__);
        goto LAB_004f4f00;
      }
    }
LAB_004f4f10:
  }
  poVar9 = std::operator<<((ostream *)&vtx,"\n");
  poVar9 = std::operator<<(poVar9,"void main (void)\n");
  poVar9 = std::operator<<(poVar9,"{\n");
  std::operator<<(poVar9,"\tgl_Position = a_position;\n");
  poVar9 = std::operator<<((ostream *)&frag,"\n");
  poVar9 = std::operator<<(poVar9,"void main (void)\n");
  std::operator<<(poVar9,"{\n");
  if ((local_460->super_ShaderRenderCase).m_isVertexCase == true) {
    std::operator<<((ostream *)&frag,"\tdEQP_FragColor = v_color;\n");
  }
  else {
    for (pbVar20 = passVars.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar20 !=
        passVars.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar20 = pbVar20 + 1) {
      poVar9 = std::operator<<((ostream *)&vtx,"\tv_");
      poVar9 = std::operator<<(poVar9,(string *)pbVar20);
      poVar9 = std::operator<<(poVar9," = ");
      poVar9 = std::operator<<(poVar9,"a_");
      poVar9 = std::operator<<(poVar9,(string *)pbVar20);
      std::operator<<(poVar9,";\n");
    }
  }
  if (local_460->m_op - OP_PRE_INCREMENT < 4) {
    poVar9 = std::operator<<((ostream *)local_468,"\t");
    pcVar7 = glu::getPrecisionName(local_44c);
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," ");
    pcVar7 = glu::getDataTypeName((DataType)local_458);
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," tmpValue = ");
    poVar9 = std::operator<<(poVar9,(string *)&inValue0);
    std::operator<<(poVar9,";\n");
    std::__cxx11::string::assign((char *)&operationValue0);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&operationValue0);
  }
  psVar12 = &operationValue1;
  std::__cxx11::string::_M_assign((string *)psVar12);
  OVar2 = MatrixCaseUtils::getOperationType(local_460->m_op);
  switch(OVar2) {
  case OPERATIONTYPE_BINARY_OPERATOR:
    poVar9 = std::operator<<((ostream *)local_468,"\t");
    pcVar7 = glu::getPrecisionName(local_44c);
    poVar9 = std::operator<<(poVar9,pcVar7);
    pcVar7 = " ";
    poVar9 = std::operator<<(poVar9," ");
    pcVar8 = glu::getDataTypeName((DataType)local_458);
    poVar9 = std::operator<<(poVar9,pcVar8);
    poVar9 = std::operator<<(poVar9," res = ");
    poVar10 = (ostringstream *)std::operator<<(poVar9,(string *)&operationValue0);
    break;
  case OPERATIONTYPE_BINARY_FUNCTION:
    poVar9 = std::operator<<((ostream *)local_468,"\t");
    pcVar7 = glu::getPrecisionName(local_44c);
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," ");
    pcVar7 = glu::getDataTypeName((DataType)local_458);
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," res = ");
    pcVar7 = MatrixCaseUtils::getOperationName(local_460->m_op);
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9,"(");
    poVar9 = std::operator<<(poVar9,(string *)&operationValue0);
    poVar9 = std::operator<<(poVar9,", ");
    goto LAB_004f5410;
  case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
    poVar9 = std::operator<<((ostream *)local_468,"\t");
    pcVar7 = glu::getPrecisionName(local_44c);
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," ");
    pcVar7 = glu::getDataTypeName((DataType)local_458);
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," res = ");
    pcVar7 = MatrixCaseUtils::getOperationName(local_460->m_op);
    poVar9 = std::operator<<(poVar9,pcVar7);
    psVar12 = &operationValue0;
    goto LAB_004f54f2;
  case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
    poVar9 = std::operator<<((ostream *)local_468,"\t");
    pcVar7 = glu::getPrecisionName(local_44c);
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," ");
    pcVar7 = glu::getDataTypeName((DataType)local_458);
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," res = ");
    poVar9 = std::operator<<(poVar9,(string *)&operationValue0);
    pcVar7 = MatrixCaseUtils::getOperationName(local_460->m_op);
    poVar9 = std::operator<<(poVar9,pcVar7);
    goto LAB_004f54fa;
  case OPERATIONTYPE_UNARY_FUNCTION:
    poVar9 = std::operator<<((ostream *)local_468,"\t");
    pcVar7 = glu::getPrecisionName(local_44c);
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," ");
    pcVar7 = glu::getDataTypeName((DataType)local_458);
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," res = ");
    pcVar7 = MatrixCaseUtils::getOperationName(local_460->m_op);
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9,"(");
    psVar12 = &operationValue0;
LAB_004f5410:
    poVar9 = std::operator<<(poVar9,(string *)psVar12);
    local_400 = ");\n";
    goto LAB_004f54fa;
  case OPERATIONTYPE_ASSIGNMENT:
    poVar9 = std::operator<<((ostream *)local_468,"\t");
    pcVar7 = glu::getPrecisionName(local_44c);
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," ");
    pcVar7 = glu::getDataTypeName((DataType)local_458);
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," res = ");
    poVar9 = std::operator<<(poVar9,(string *)&operationValue0);
    std::operator<<(poVar9,";\n");
    pcVar7 = "\tres ";
    poVar10 = local_468;
    break;
  default:
    goto switchD_004f5139_default;
  }
  poVar9 = std::operator<<((ostream *)poVar10,pcVar7);
  pcVar7 = MatrixCaseUtils::getOperationName(local_460->m_op);
  poVar9 = std::operator<<(poVar9,pcVar7);
  poVar9 = std::operator<<(poVar9," ");
  psVar12 = &operationValue1;
LAB_004f54f2:
  poVar9 = std::operator<<(poVar9,(string *)psVar12);
LAB_004f54fa:
  std::operator<<(poVar9,local_400);
switchD_004f5139_default:
  poVar9 = std::operator<<((ostream *)local_468,"\t");
  pcVar7 = "dEQP_FragColor";
  if ((local_460->super_ShaderRenderCase).m_isVertexCase != false) {
    pcVar7 = "v_color";
  }
  poVar9 = std::operator<<(poVar9,pcVar7);
  std::operator<<(poVar9," = ");
  if (local_460->m_op - OP_PRE_INCREMENT < 4) {
    pSVar14 = (ShaderMatrixCase *)0x9afe87;
    poVar9 = std::operator<<((ostream *)local_468,"vec4(");
    genGLSLMatToVec3Reduction_abi_cxx11_((string *)&local_440,pSVar14,&resultType,"res");
    poVar9 = std::operator<<(poVar9,(string *)&local_440);
    pcVar7 = ", 1.0) + vec4(";
    poVar9 = std::operator<<(poVar9,", 1.0) + vec4(");
    genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_3c0,(ShaderMatrixCase *)pcVar7,&resultType,"tmpValue");
    poVar9 = std::operator<<(poVar9,(string *)&local_3c0);
    std::operator<<(poVar9,", 0.0);\n");
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  else {
    pSVar14 = (ShaderMatrixCase *)0x9afe87;
    poVar9 = std::operator<<((ostream *)local_468,"vec4(");
    genGLSLMatToVec3Reduction_abi_cxx11_((string *)&local_440,pSVar14,&resultType,"res");
    poVar9 = std::operator<<(poVar9,(string *)&local_440);
    std::operator<<(poVar9,", 1.0);\n");
  }
  std::__cxx11::string::~string((string *)&local_440);
  std::operator<<((ostream *)&vtx,"}\n");
  std::operator<<((ostream *)&frag,"}\n");
  std::__cxx11::stringbuf::str();
  pSVar14 = local_460;
  std::__cxx11::string::operator=
            ((string *)&(local_460->super_ShaderRenderCase).m_vertShaderSource,(string *)&local_440)
  ;
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(pSVar14->super_ShaderRenderCase).m_fragShaderSource,(string *)&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  this_00 = &(pSVar14->super_ShaderRenderCase).m_userAttribTransforms;
  ctx_00 = (EVP_PKEY_CTX *)0x4;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (this_00,4);
  uVar15 = 1;
  uVar13 = 3;
  lVar11 = 0;
  poVar9 = (ostream *)0x0;
  for (lVar18 = 0; lVar18 != 0x100; lVar18 = lVar18 + 0x40) {
    local_3c0._M_dataplus._M_p._0_4_ = 0;
    local_468 = (ostringstream *)poVar9;
    tcu::Matrix<float,_4,_4>::Matrix(&local_440,(float *)&local_3c0);
    tcu::Matrix<float,_4,_4>::operator=
              ((Matrix<float,_4,_4> *)
               ((long)(((this_00->
                        super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
               lVar18),&local_440);
    pMVar1 = (this_00->
             super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ctx_00 = (EVP_PKEY_CTX *)((long)(pMVar1->m_data).m_data[0].m_data + lVar18);
    *(undefined8 *)((long)((pMVar1->m_data).m_data + 3) + lVar18) = 0x3dcccccd3e4ccccd;
    *(float *)((long)((pMVar1->m_data).m_data + 3) + 8U + lVar18) =
         (float)(int)local_468 * 0.15 + 0.4;
    *(undefined4 *)((long)((pMVar1->m_data).m_data + 3) + 0xcU + lVar18) = 0x3f333333;
    *(undefined4 *)((long)(pMVar1->m_data).m_data[0].m_data + lVar11) = 0x3f800000;
    poVar9 = (ostream *)(local_468 + 1);
    *(undefined4 *)(ctx_00 + (ulong)(uVar15 & 3) * 4 + 0x10) = 0x3f800000;
    *(undefined4 *)(ctx_00 + ((ulong)local_468 ^ 2) * 4 + 0x20) = 0x3f800000;
    *(undefined4 *)(ctx_00 + (ulong)(uVar13 & 3) * 4 + 0x30) = 0x3f800000;
    lVar11 = lVar11 + 0x44;
    uVar15 = (uVar15 & 3) + 1;
    uVar13 = (uVar13 & 3) + 1;
  }
  TVar5 = MatrixCaseUtils::getOperationTestMatrixType(local_460->m_op);
  if (TVar5 != TESTMATRIXTYPE_DEFAULT) {
    lVar11 = 0;
    for (ctx_00 = (EVP_PKEY_CTX *)0x0; ctx_00 != (EVP_PKEY_CTX *)0x4; ctx_00 = ctx_00 + 1) {
      lVar18 = lVar11;
      for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
        pMVar1 = (this_00->
                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        for (lVar17 = 0; lVar17 != 0x40; lVar17 = lVar17 + 0x10) {
          switch(TVar5) {
          case TESTMATRIXTYPE_NEGATED:
            fVar21 = -*(float *)((long)(pMVar1->m_data).m_data[0].m_data + lVar17 + lVar18);
            break;
          case TESTMATRIXTYPE_INCREMENTED:
            fVar21 = *(float *)((long)(pMVar1->m_data).m_data[0].m_data + lVar17 + lVar18) + 0.3;
            break;
          case TESTMATRIXTYPE_DECREMENTED:
            fVar21 = *(float *)((long)(pMVar1->m_data).m_data[0].m_data + lVar17 + lVar18) + -0.3;
            break;
          case TESTMATRIXTYPE_NEGATED_INCREMENTED:
            fVar21 = 0.3 - *(float *)((long)(pMVar1->m_data).m_data[0].m_data + lVar17 + lVar18);
            break;
          case TESTMATRIXTYPE_INCREMENTED_LESS:
            fVar21 = *(float *)((long)(pMVar1->m_data).m_data[0].m_data + lVar17 + lVar18) + -0.1;
            break;
          default:
            goto switchD_004f5820_default;
          }
          *(float *)((long)(pMVar1->m_data).m_data[0].m_data + lVar17 + lVar18) = fVar21;
switchD_004f5820_default:
        }
        lVar18 = lVar18 + 4;
      }
      lVar11 = lVar11 + 0x40;
    }
  }
  deqp::gls::ShaderRenderCase::init(&local_460->super_ShaderRenderCase,ctx_00);
  std::__cxx11::string::~string((string *)&operationValue1);
  std::__cxx11::string::~string((string *)&operationValue0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&passVars);
  std::__cxx11::string::~string((string *)&inValue1);
  std::__cxx11::string::~string((string *)&inValue0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
  iVar6 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
  return iVar6;
}

Assistant:

void ShaderMatrixCase::init (void)
{
	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op				= m_isVertexCase ? vtx : frag;

	bool				isInDynMat0		= isDataTypeMatrix(m_in0.dataType) && m_in0.inputType == INPUTTYPE_DYNAMIC;
	bool				isInDynMat1		= isDataTypeMatrix(m_in1.dataType) && m_in1.inputType == INPUTTYPE_DYNAMIC;
	string				inValue0;
	string				inValue1;
	DataType			resultType		= TYPE_LAST;
	Precision			resultPrec		= m_in0.precision;
	vector<string>		passVars;
	int					numInputs		= (isOperationBinary(m_op)) ? (2) : (1);

	std::string			operationValue0;
	std::string			operationValue1;

	DE_ASSERT(!isInDynMat0 || !isInDynMat1); // Only single dynamic matrix input is allowed.
	DE_UNREF(isInDynMat0 && isInDynMat1);

	// Compute result type.
	if (m_op == OP_MUL && isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		resultType = getDataTypeMatrix(getDataTypeMatrixNumColumns(m_in1.dataType), getDataTypeMatrixNumRows(m_in0.dataType));
	}
	else if (m_op == OP_OUTER_PRODUCT)
	{
		resultType = getDataTypeMatrix(getDataTypeScalarSize(m_in1.dataType), getDataTypeScalarSize(m_in0.dataType));
	}
	else if (m_op == OP_TRANSPOSE)
	{
		resultType = getDataTypeMatrix(getDataTypeMatrixNumRows(m_in0.dataType), getDataTypeMatrixNumColumns(m_in0.dataType));
	}
	else if (m_op == OP_INVERSE)
	{
		resultType = m_in0.dataType;
	}
	else if (m_op == OP_DETERMINANT)
	{
		resultType = TYPE_FLOAT;
	}
	else if (getOperationType(m_op) == OPERATIONTYPE_UNARY_PREFIX_OPERATOR ||
			 getOperationType(m_op) == OPERATIONTYPE_UNARY_POSTFIX_OPERATOR)
	{
		resultType = m_in0.dataType;
	}
	else if (isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		DE_ASSERT(m_in0.dataType == m_in1.dataType);
		resultType = m_in0.dataType;
	}
	else if (isDataTypeMatrix(m_in0.dataType) || isDataTypeMatrix(m_in1.dataType))
	{
		int			matNdx		= isDataTypeMatrix(m_in0.dataType) ? 0 : 1;
		DataType	matrixType	= matNdx == 0 ? m_in0.dataType : m_in1.dataType;
		DataType	otherType	= matNdx == 0 ? m_in1.dataType : m_in0.dataType;

		if (otherType == TYPE_FLOAT)
			resultType = matrixType;
		else
		{
			DE_ASSERT(isDataTypeVector(otherType));
			resultType = getDataTypeFloatVec(matNdx == 0 ? getDataTypeMatrixNumRows(matrixType) : getDataTypeMatrixNumColumns(matrixType));
		}
	}
	else
	{
		DE_ASSERT(DE_FALSE);
	}

	vtx << "#version 300 es\n";
	frag << "#version 300 es\n";

	vtx << "in highp vec4 a_position;\n";
	frag << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";
	if (m_isVertexCase)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}

	// Input declarations.
	for (int inNdx = 0; inNdx < numInputs; inNdx++)
	{
		const ShaderInput&	in			= inNdx > 0 ? m_in1 : m_in0;
		const char*			precName	= getPrecisionName(in.precision);
		const char*			typeName	= getDataTypeName(in.dataType);
		string&				inValue		= inNdx > 0 ? inValue1 : inValue0;

		if (in.inputType == INPUTTYPE_DYNAMIC)
		{
			vtx << "in " << precName << " " << typeName << " a_";

			if (isDataTypeMatrix(in.dataType))
			{
				// a_matN, v_matN
				vtx << typeName << ";\n";
				if (!m_isVertexCase)
				{
					vtx << "out " << precName << " " << typeName << " v_" << typeName << ";\n";
					frag << "in " << precName << " " << typeName << " v_" << typeName << ";\n";
					passVars.push_back(typeName);
				}

				inValue = string(m_isVertexCase ? "a_" : "v_") + getDataTypeName(in.dataType);
			}
			else
			{
				// a_coords, v_coords
				vtx << "coords;\n";
				if (!m_isVertexCase)
				{
					vtx << "out " << precName << " " << typeName << " v_coords;\n";
					frag << "in " << precName << " " << typeName << " v_coords;\n";
					passVars.push_back("coords");
				}

				inValue = m_isVertexCase ? "a_coords" : "v_coords";
			}
		}
		else if (in.inputType == INPUTTYPE_UNIFORM)
		{
			op << "uniform " << precName << " " << typeName << " u_in" << inNdx << ";\n";
			inValue = string("u_in") + de::toString(inNdx);
		}
		else if (in.inputType == INPUTTYPE_CONST)
		{
			op << "const " << precName << " " << typeName << " in" << inNdx << " = ";

			// Generate declaration.
			switch (in.dataType)
			{
				case TYPE_FLOAT:		op << de::floatToString(s_constInFloat[inNdx], 1);					break;
				case TYPE_FLOAT_VEC2:	writeVectorConstructor<2>(op, s_constInVec2[inNdx]);				break;
				case TYPE_FLOAT_VEC3:	writeVectorConstructor<3>(op, s_constInVec3[inNdx]);				break;
				case TYPE_FLOAT_VEC4:	writeVectorConstructor<4>(op, s_constInVec4[inNdx]);				break;
				case TYPE_FLOAT_MAT2:	writeMatrixConstructor<2, 2>(op, Mat2(s_constInMat2x2[inNdx]));		break;
				case TYPE_FLOAT_MAT2X3:	writeMatrixConstructor<2, 3>(op, Mat2x3(s_constInMat2x3[inNdx]));	break;
				case TYPE_FLOAT_MAT2X4:	writeMatrixConstructor<2, 4>(op, Mat2x4(s_constInMat2x4[inNdx]));	break;
				case TYPE_FLOAT_MAT3X2:	writeMatrixConstructor<3, 2>(op, Mat3x2(s_constInMat3x2[inNdx]));	break;
				case TYPE_FLOAT_MAT3:	writeMatrixConstructor<3, 3>(op, Mat3(s_constInMat3x3[inNdx]));		break;
				case TYPE_FLOAT_MAT3X4:	writeMatrixConstructor<3, 4>(op, Mat3x4(s_constInMat3x4[inNdx]));	break;
				case TYPE_FLOAT_MAT4X2:	writeMatrixConstructor<4, 2>(op, Mat4x2(s_constInMat4x2[inNdx]));	break;
				case TYPE_FLOAT_MAT4X3:	writeMatrixConstructor<4, 3>(op, Mat4x3(s_constInMat4x3[inNdx]));	break;
				case TYPE_FLOAT_MAT4:	writeMatrixConstructor<4, 4>(op, Mat4(s_constInMat4x4[inNdx]));		break;

				default:
					DE_ASSERT(DE_FALSE);
			}

			op << ";\n";

			inValue = string("in") + de::toString(inNdx);
		}
	}

	vtx << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\n"
		 << "void main (void)\n"
		 << "{\n";

	if (m_isVertexCase)
		frag << "	dEQP_FragColor = v_color;\n";
	else
	{
		for (vector<string>::const_iterator copyIter = passVars.begin(); copyIter != passVars.end(); copyIter++)
			vtx << "	v_" << *copyIter << " = " << "a_" << *copyIter << ";\n";
	}

	// Operation.

	switch (getOperationNature(m_op))
	{
		case OPERATIONNATURE_PURE:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_MUTATING:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " tmpValue = " << inValue0 << ";\n";

			operationValue0 = "tmpValue";
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_ASSIGNMENT:
			DE_ASSERT(getOperationType(m_op) == OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (getOperationType(m_op))
	{
		case OPERATIONTYPE_BINARY_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << " " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << operationValue0 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << getOperationName(m_op) << ";\n";
			break;

		case OPERATIONTYPE_BINARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ", " << operationValue1 << ");\n";
			break;

		case OPERATIONTYPE_UNARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ");\n";
			break;

		case OPERATIONTYPE_ASSIGNMENT:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << ";\n";
			op << "	res " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Reduction to vec3 (rgb). Check the used value too if it was modified
	op << "	" << (m_isVertexCase ? "v_color" : "dEQP_FragColor") << " = ";

	if (isOperationValueModifying(m_op))
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0) + vec4(" << genGLSLMatToVec3Reduction(resultType, "tmpValue") << ", 0.0);\n";
	else
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0);\n";

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource	= vtx.str();
	m_fragShaderSource	= frag.str();

	// \todo [2012-02-14 pyry] Compute better values for matrix tests.
	m_userAttribTransforms.resize(4);
	for (int attribNdx = 0; attribNdx < 4; attribNdx++)
	{
		m_userAttribTransforms[attribNdx] = Mat4(0.0f);
		m_userAttribTransforms[attribNdx](                  0, 3) = 0.2f;								// !< prevent matrix*vec from going into zero (assuming vec.w != 0)
		m_userAttribTransforms[attribNdx](                  1, 3) = 0.1f;								// !<
		m_userAttribTransforms[attribNdx](                  2, 3) = 0.4f + 0.15f * float(attribNdx);	// !<
		m_userAttribTransforms[attribNdx](                  3, 3) = 0.7f;								// !<
		m_userAttribTransforms[attribNdx]((0 + attribNdx) % 4, 0) = 1.0f;
		m_userAttribTransforms[attribNdx]((1 + attribNdx) % 4, 1) = 1.0f;
		m_userAttribTransforms[attribNdx]((2 + attribNdx) % 4, 2) = 1.0f;
		m_userAttribTransforms[attribNdx]((3 + attribNdx) % 4, 3) = 1.0f;
	}

	// prevent bad reference cases such as black result images by fine-tuning used matrices
	if (getOperationTestMatrixType(m_op) != TESTMATRIXTYPE_DEFAULT)
	{
		for (int attribNdx = 0; attribNdx < 4; attribNdx++)
		{
			for (int row = 0; row < 4; row++)
			for (int col = 0; col < 4; col++)
			{
				switch (getOperationTestMatrixType(m_op))
				{
					case TESTMATRIXTYPE_NEGATED:
						m_userAttribTransforms[attribNdx](row, col) = -m_userAttribTransforms[attribNdx](row, col);
						break;
					case TESTMATRIXTYPE_INCREMENTED:
						m_userAttribTransforms[attribNdx](row, col) += 0.3f;
						break;
					case TESTMATRIXTYPE_DECREMENTED:
						m_userAttribTransforms[attribNdx](row, col) -= 0.3f;
						break;
					case TESTMATRIXTYPE_NEGATED_INCREMENTED:
						m_userAttribTransforms[attribNdx](row, col) = -m_userAttribTransforms[attribNdx](row, col) + 0.3f;
						break;
					case TESTMATRIXTYPE_INCREMENTED_LESS:
						m_userAttribTransforms[attribNdx](row, col) -= 0.1f;
						break;

					default:
						DE_ASSERT(DE_FALSE);
						break;
				}
			}
		}
	}

	ShaderRenderCase::init();
}